

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

nhdp_domain *
nhdp_domain_configure(uint8_t ext,char *metric_name,char *mpr_name,uint8_t willingness)

{
  nhdp_domain *domain;
  uint8_t willingness_local;
  char *mpr_name_local;
  char *metric_name_local;
  nhdp_domain *pnStack_38;
  uint8_t ext_local;
  
  pnStack_38 = nhdp_domain_add(ext);
  if (pnStack_38 == (nhdp_domain *)0x0) {
    pnStack_38 = (nhdp_domain *)0x0;
  }
  else {
    if (((&log_global_mask)[LOG_NHDP] & 1) != 0) {
      oonf_log(1,LOG_NHDP,"src/nhdp/nhdp/nhdp_domain.c",0x486,0,0,"Configure domain %u to metric=%s"
               ,pnStack_38->index,metric_name);
    }
    _apply_metric(pnStack_38,metric_name);
    if (((&log_global_mask)[LOG_NHDP] & 1) != 0) {
      oonf_log(1,LOG_NHDP,"src/nhdp/nhdp/nhdp_domain.c",0x489,0,0,
               "Configure domain %u to mpr=%s, willingness=%u",pnStack_38->index,mpr_name,
               willingness);
    }
    _apply_mpr(pnStack_38,mpr_name,willingness);
    oonf_class_event(&_domain_class,pnStack_38,0);
  }
  return pnStack_38;
}

Assistant:

struct nhdp_domain *
nhdp_domain_configure(uint8_t ext, const char *metric_name, const char *mpr_name, uint8_t willingness) {
  struct nhdp_domain *domain;

  domain = nhdp_domain_add(ext);
  if (domain == NULL) {
    return NULL;
  }

  OONF_DEBUG(LOG_NHDP, "Configure domain %u to metric=%s", domain->index, metric_name);
  _apply_metric(domain, metric_name);

  OONF_DEBUG(LOG_NHDP, "Configure domain %u to mpr=%s, willingness=%u", domain->index, mpr_name, willingness);
  _apply_mpr(domain, mpr_name, willingness);

  oonf_class_event(&_domain_class, domain, OONF_OBJECT_CHANGED);

  return domain;
}